

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

void labldump(FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  t_symbol *ptVar4;
  t_symbol *ptVar5;
  
  fwrite("Label\t\t\t\tAddr\tBank\n",0x13,1,(FILE *)fp);
  fwrite("-----\t\t\t\t----\t----\n",0x13,1,(FILE *)fp);
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    ptVar5 = (t_symbol *)(hash_tbl + lVar3);
    while (ptVar5 = ptVar5->next, ptVar5 != (t_symbol *)0x0) {
      pcVar1 = ptVar5->name + 1;
      fprintf((FILE *)fp,"%s\t",pcVar1);
      sVar2 = strlen(pcVar1);
      if (sVar2 < 8) {
        fputc(9,(FILE *)fp);
      }
      sVar2 = strlen(pcVar1);
      if (sVar2 < 0x10) {
        fputc(9,(FILE *)fp);
      }
      sVar2 = strlen(pcVar1);
      if (sVar2 < 0x18) {
        fputc(9,(FILE *)fp);
      }
      fprintf((FILE *)fp,"%4.4x\t %2.2x\n",(ulong)(uint)ptVar5->value,(ulong)(uint)ptVar5->bank);
      ptVar4 = ptVar5->local;
      if (ptVar4 != (t_symbol *)0x0) {
        for (; ptVar4 != (t_symbol *)0x0; ptVar4 = ptVar4->next) {
          pcVar1 = ptVar4->name + 1;
          fprintf((FILE *)fp,"\t%s\t",pcVar1);
          sVar2 = strlen(pcVar1);
          if (sVar2 < 8) {
            fputc(9,(FILE *)fp);
          }
          sVar2 = strlen(pcVar1);
          if (sVar2 < 0x10) {
            fputc(9,(FILE *)fp);
          }
          fprintf((FILE *)fp,"%4.4x\t %2.2x\n",(ulong)(uint)ptVar4->value,(ulong)(uint)ptVar4->bank)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void
labldump(FILE *fp)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	int i;

	fprintf(fp, "Label\t\t\t\tAddr\tBank\n");
	fprintf(fp, "-----\t\t\t\t----\t----\n");

	/* browse the symbol table */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];
		while (sym) {
			/* dump the label */
			fprintf(fp, "%s\t", &(sym->name[1]));
			if (strlen(&(sym->name[1])) < 8)
				fprintf(fp, "\t");
			if (strlen(&(sym->name[1])) < 16)
				fprintf(fp, "\t");
			if (strlen(&(sym->name[1])) < 24)
				fprintf(fp, "\t");
			fprintf(fp, "%4.4x\t %2.2x\n", sym->value, sym->bank);

			/* local symbols */
			if (sym->local) {
				local = sym->local;

				while  (local) {
					fprintf(fp, "\t%s\t", &(local->name[1]));
					if (strlen(&(local->name[1])) < 8)
						fprintf(fp, "\t");
					if (strlen(&(local->name[1])) < 16)
						fprintf(fp, "\t");
					fprintf(fp, "%4.4x\t %2.2x\n", local->value, local->bank);

					/* next */
					local = local->next;
				}
			}

			/* next */
			sym = sym->next;
		}
	}
}